

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.cpp
# Opt level: O0

void __thiscall
FMB::FiniteModelMultiSorted::addFunctionDefinition
          (FiniteModelMultiSorted *this,uint f,DArray<unsigned_int> *args,uint res)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  Symbol *this_00;
  Term *this_01;
  DArray<int> *pDVar5;
  int *piVar6;
  uint *puVar7;
  uint in_ECX;
  DArray<unsigned_int> *in_RDX;
  int in_ESI;
  OperatorType *in_RDI;
  uint var;
  uint srtU;
  TermList srt;
  uint arity;
  undefined8 in_stack_ffffffffffffffa8;
  Signature *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  uint in_stack_ffffffffffffffd4;
  TermList in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff0;
  int iVar8;
  
  uVar3 = (uint)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  sVar4 = Lib::DArray<unsigned_int>::size(in_RDX);
  iVar2 = (int)sVar4;
  iVar8 = in_ESI;
  if (iVar2 == 0) {
    this_00 = Kernel::Signature::getFunction(in_stack_ffffffffffffffb0,uVar3);
    bVar1 = Kernel::Signature::Symbol::introduced(this_00);
    iVar8 = in_ESI;
    if (!bVar1) {
      Kernel::Signature::getFunction(in_stack_ffffffffffffffb0,uVar3);
      Kernel::Signature::Symbol::fnType
                ((Symbol *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      in_stack_ffffffffffffffd8 =
           Kernel::OperatorType::result
                     ((OperatorType *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8))
      ;
      this_01 = Kernel::TermList::term((TermList *)0x2d2b20);
      in_stack_ffffffffffffffd4 = Kernel::Term::functor(this_01);
      pDVar5 = Lib::DArray<Lib::DArray<int>_>::operator[]
                         ((DArray<Lib::DArray<int>_> *)&in_RDI[7]._typeArgsArity,
                          (ulong)in_stack_ffffffffffffffd4);
      piVar6 = Lib::DArray<int>::operator[](pDVar5,(ulong)in_ECX);
      iVar8 = in_ESI;
      if (*piVar6 == -1) {
        pDVar5 = Lib::DArray<Lib::DArray<int>_>::operator[]
                           ((DArray<Lib::DArray<int>_> *)&in_RDI[7]._typeArgsArity,
                            (ulong)in_stack_ffffffffffffffd4);
        piVar6 = Lib::DArray<int>::operator[](pDVar5,(ulong)in_ECX);
        *piVar6 = in_ESI;
        in_stack_ffffffffffffffc4 = in_ESI;
      }
    }
  }
  Kernel::Signature::getFunction
            ((Signature *)&in_RDI[1]._typeArgsArity,(uint)((ulong)in_RDX >> 0x20));
  Kernel::Signature::Symbol::fnType
            ((Symbol *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  uVar3 = args2var((FiniteModelMultiSorted *)CONCAT44(iVar8,in_stack_fffffffffffffff0),in_RDX,
                   (DArray<unsigned_int> *)CONCAT44(in_ECX,iVar2),
                   (DArray<unsigned_int> *)in_stack_ffffffffffffffd8._content,
                   in_stack_ffffffffffffffd4,in_RDI);
  puVar7 = Lib::DArray<unsigned_int>::operator[]
                     ((DArray<unsigned_int> *)&in_RDI[4]._typeArgsArity,(ulong)uVar3);
  *puVar7 = in_ECX;
  return;
}

Assistant:

void FiniteModelMultiSorted::addFunctionDefinition(unsigned f, const DArray<unsigned>& args, unsigned res)
{
  ASS_EQ(env.signature->functionArity(f),args.size());

  unsigned arity = args.size();

  if(arity==0 && !env.signature->getFunction(f)->introduced()){
    TermList srt = env.signature->getFunction(f)->fnType()->result();
    unsigned srtU = srt.term()->functor();
    if(sortRepr[srtU][res] == -1){
      //cout << "Rep " << env.signature->functionName(f) << " for ";
      //cout << env.sorts->sortName(srt) << " and " << res << endl;
      sortRepr[srtU][res]=f;
    }
  }

  unsigned var = args2var(args,_sizes,_f_offsets,f,env.signature->getFunction(f)->fnType());

  ASS_L(var, _f_interpretation.size());
  _f_interpretation[var] = res;
}